

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unlink.cc
# Opt level: O0

int main(int argc,char **argv)

{
  sys_error *e;
  char **argv_local;
  int argc_local;
  
  if (1 < argc) {
    ixxx::posix::unlink(argv[1]);
  }
  else {
    std::operator<<((ostream *)&std::cerr,"Missing argument\n");
  }
  argv_local._4_4_ = (uint)(1 >= argc);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
    if (argc<2) { cerr << "Missing argument\n"; return 1; }
    try {
        posix::unlink(argv[1]);
    } catch (const ixxx::sys_error& e) {
        cerr << "Error: " << e.what() << '\n';
    }
    return 0;
}